

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O1

void burstsort_mkq_recursiveburst_1(uchar **strings,size_t N)

{
  byte bVar1;
  iterator __position;
  long lVar2;
  bool bVar3;
  byte bVar4;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *this;
  uchar *oracle;
  TSTNode<unsigned_char> *pTVar5;
  sbyte sVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  size_t __size;
  size_t sVar12;
  long lVar13;
  size_t depth;
  uint uVar14;
  TSTNode<unsigned_char> *pTVar15;
  uchar *str;
  TSTNode<unsigned_char> root;
  BurstRecursive<unsigned_char> local_81;
  uchar **local_80;
  byte *local_78;
  size_t local_70;
  long local_68;
  size_t local_60;
  TSTNode<unsigned_char> local_58;
  
  local_58.buckets._M_elems[2] = (void *)0x0;
  local_58.is_tst.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  local_58.buckets._M_elems[0] = (void *)0x0;
  local_58.buckets._M_elems[1] = (void *)0x0;
  local_80 = strings;
  bVar4 = pseudo_median<unsigned_char>(strings,N,0);
  local_58.pivot = bVar4;
  local_60 = N;
  if (N != 0) {
    sVar12 = 0;
    do {
      local_78 = local_80[sVar12];
      if (local_78 == (byte *)0x0) {
LAB_00213829:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar8 = *local_78;
      uVar14 = (uint)(bVar8 == bVar4) + (uint)(bVar4 <= bVar8 && bVar8 != bVar4) * 2;
      sVar6 = (sbyte)uVar14;
      pTVar15 = &local_58;
      lVar13 = 0;
      uVar10 = (uint)local_58.is_tst.super__Base_bitset<1UL>._M_w;
      while( true ) {
        if ((uVar10 >> uVar14 & 1) == 0) break;
        if (uVar14 == 1) {
          bVar8 = local_78[lVar13 + 1];
          lVar13 = lVar13 + 1;
        }
        pTVar15 = (TSTNode<unsigned_char> *)(pTVar15->buckets)._M_elems[uVar14];
        bVar1 = pTVar15->pivot;
        uVar14 = (uint)(bVar8 == bVar1) + (uint)(bVar1 <= bVar8 && bVar8 != bVar1) * 2;
        uVar10 = (uint)(pTVar15->is_tst).super__Base_bitset<1UL>._M_w;
        sVar6 = (sbyte)uVar14;
      }
      this = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
             (pTVar15->buckets)._M_elems[uVar14];
      if (this == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
        this = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
        *(undefined8 *)(this + 0x10) = 0;
        (pTVar15->buckets)._M_elems[uVar14] = this;
      }
      __position._M_current = *(uchar ***)(this + 8);
      if (__position._M_current == *(uchar ***)(this + 0x10)) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(this,__position,&local_78);
      }
      else {
        *__position._M_current = local_78;
        *(long *)(this + 8) = *(long *)(this + 8) + 8;
      }
      if ((uVar14 != 1) || (pTVar15->pivot != '\0')) {
        lVar9 = *(long *)this;
        lVar2 = *(long *)(this + 8);
        __size = lVar2 - lVar9 >> 3;
        if ((0x2000 < __size) && (lVar2 == *(long *)(this + 0x10))) {
          depth = lVar13 + (ulong)(uVar14 == 1);
          local_70 = sVar12;
          local_68 = lVar2;
          oracle = (uchar *)malloc(__size);
          if (local_68 != lVar9) {
            uVar7 = 0;
            uVar11 = 1;
            do {
              lVar13 = *(long *)(lVar9 + uVar7 * 8);
              if (lVar13 == 0) goto LAB_00213829;
              oracle[uVar7] = *(uchar *)(lVar13 + depth);
              lVar9 = *(long *)this;
              bVar3 = uVar11 < (ulong)(*(long *)(this + 8) - lVar9 >> 3);
              uVar7 = uVar11;
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (bVar3);
          }
          verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
                    (&local_58,0);
          pTVar5 = BurstRecursive<unsigned_char>::operator()
                             (&local_81,
                              (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this,
                              oracle,depth);
          free(oracle);
          if (*(void **)this != (void *)0x0) {
            operator_delete(*(void **)this);
          }
          operator_delete(this);
          (pTVar15->buckets)._M_elems[uVar14] = pTVar5;
          (pTVar15->is_tst).super__Base_bitset<1UL>._M_w =
               (pTVar15->is_tst).super__Base_bitset<1UL>._M_w | 1L << sVar6;
          verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
                    (&local_58,0);
          sVar12 = local_70;
        }
      }
      sVar12 = sVar12 + 1;
    } while (sVar12 != local_60);
  }
  verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>(&local_58,0);
  burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
            (&local_58,local_80,0,0);
  return;
}

Assistant:

void burstsort_mkq_recursiveburst_1(unsigned char** strings, size_t N)
{ burstsort_mkq_recursiveburst<unsigned char>(strings, N); }